

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QPoint __thiscall QWidget::pos(QWidget *this)

{
  uint uVar1;
  ulong uVar2;
  QWExtra *pQVar3;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar4;
  ulong uVar5;
  ulong uVar6;
  QRect QVar7;
  
  uVar2 = *(ulong *)&this->data->crect;
  uVar5 = uVar2 >> 0x20;
  uVar1 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar6 = uVar2;
  if ((uVar1 & 0xff) != 9 && (uVar1 & 1) != 0) {
    pQVar3 = ((*(QWidgetPrivate **)&this->field_0x8)->extra)._M_t.
             super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (((pQVar3 == (QWExtra *)0x0) ||
        (tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
              *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
               &(pQVar3->topextra)._M_t.
                super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
        tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
        (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) ||
       ((*(byte *)((long)tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe1) & 1) == 0))
    {
      QVar7 = QWidgetPrivate::frameStrut(*(QWidgetPrivate **)&this->field_0x8);
      uVar6 = uVar2 - QVar7._0_8_;
      uVar5 = (ulong)(uint)((int)(uVar2 >> 0x20) - QVar7.y1.m_i);
    }
  }
  return (QPoint)(uVar6 & 0xffffffff | uVar5 << 0x20);
}

Assistant:

QPoint QWidget::pos() const
{
    Q_D(const QWidget);
    QPoint result = data->crect.topLeft();
    if (isWindow() && ! (windowType() == Qt::Popup))
        if (!d->maybeTopData() || !d->maybeTopData()->posIncludesFrame)
            result -= d->frameStrut().topLeft();
    return result;
}